

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgStack.h
# Opt level: O2

dgListNode ** __thiscall
dgStack<dgList<dgConvexHull3DFace>::dgListNode_*>::operator[]
          (dgStack<dgList<dgConvexHull3DFace>::dgListNode_*> *this,HaI32 entry)

{
  uint __line;
  char *__assertion;
  
  if (entry < 0) {
    __assertion = "entry >= 0";
    __line = 0x5f;
  }
  else {
    if (this->m_size == 0 && entry == 0 || entry < this->m_size) {
      return (dgListNode **)((ulong)(uint)entry * 8 + (long)(this->super_dgStackBase).m_ptr);
    }
    __assertion = "(entry < m_size) || ((m_size == 0) && (entry == 0))";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,__line,
                "T &dgStack<dgList<dgConvexHull3DFace>::dgListNode *>::operator[](hacd::HaI32) [T = dgList<dgConvexHull3DFace>::dgListNode *]"
               );
}

Assistant:

T& dgStack<T>::operator[] (hacd::HaI32 entry) 
{
	T *mem;

	HACD_ASSERT (entry >= 0);
	HACD_ASSERT ((entry < m_size) || ((m_size == 0) && (entry == 0)));

	mem = (T*) m_ptr;
	return mem[entry];
}